

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QNetworkRequest::KnownHeaders,QVariant>::emplace<QVariant_const&>
          (QHash<QNetworkRequest::KnownHeaders,_QVariant> *this,KnownHeaders *key,QVariant *args)

{
  bool bVar1;
  QVariant *in_RDX;
  QVariant *in_RSI;
  KnownHeaders *in_RDI;
  long in_FS_OFFSET;
  QHash<QNetworkRequest::KnownHeaders,_QVariant> copy;
  QHash<QNetworkRequest::KnownHeaders,_QVariant> *in_stack_ffffffffffffff88;
  QHash<QNetworkRequest::KnownHeaders,_QVariant> *in_stack_ffffffffffffff90;
  QVariant *in_stack_ffffffffffffff98;
  piter local_40;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QHash<QNetworkRequest::KnownHeaders,_QVariant>::isDetached(in_stack_ffffffffffffff90);
  if (bVar1) {
    bVar1 = QHashPrivate::Data<QHashPrivate::Node<QNetworkRequest::KnownHeaders,_QVariant>_>::
            shouldGrow(*(Data<QHashPrivate::Node<QNetworkRequest::KnownHeaders,_QVariant>_> **)
                        in_RDI);
    if (bVar1) {
      QVariant::QVariant(&local_28,in_RDX);
      local_40 = (piter)QHash<QNetworkRequest::KnownHeaders,_QVariant>::emplace_helper<QVariant>
                                  ((QHash<QNetworkRequest::KnownHeaders,_QVariant> *)in_RDX,in_RDI,
                                   in_RSI);
      QVariant::~QVariant(&local_28);
    }
    else {
      local_40 = (piter)emplace_helper<QVariant_const&>
                                  ((QHash<QNetworkRequest::KnownHeaders,_QVariant> *)in_RDX,in_RDI,
                                   in_stack_ffffffffffffff98);
    }
  }
  else {
    QHash<QNetworkRequest::KnownHeaders,_QVariant>::QHash
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    QHash<QNetworkRequest::KnownHeaders,_QVariant>::detach(in_stack_ffffffffffffff90);
    local_40 = (piter)emplace_helper<QVariant_const&>
                                ((QHash<QNetworkRequest::KnownHeaders,_QVariant> *)in_RDX,in_RDI,
                                 in_stack_ffffffffffffff98);
    QHash<QNetworkRequest::KnownHeaders,_QVariant>::~QHash(in_stack_ffffffffffffff90);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_40;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }